

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

String * __thiscall
Diligent::GetCPUAccessFlagsString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,Uint32 CpuAccessFlags)

{
  uint uVar1;
  ulong uVar2;
  Uint32 Flag;
  uint uVar3;
  string msg;
  
  if ((int)this == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"0",(allocator *)&msg);
  }
  else {
    uVar2 = (ulong)this & 0xffffffff;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    for (uVar3 = 1; (uVar1 = (uint)uVar2, uVar1 != 0 && (uVar3 < 3)); uVar3 = uVar3 * 2) {
      if ((uVar3 & uVar1) != 0) {
        if (__return_storage_ptr__->_M_string_length != 0) {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar2 = (ulong)(uVar1 & ~uVar3);
      }
    }
    if (uVar1 != 0) {
      FormatString<char[30]>(&msg,(char (*) [30])"Unknown CPU access flags left");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetCPUAccessFlagsString",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x4d3);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String GetCPUAccessFlagsString(Uint32 CpuAccessFlags)
{
    if (CpuAccessFlags == 0)
        return "0";
    String Str;
    for (Uint32 Flag = CPU_ACCESS_READ; CpuAccessFlags && Flag <= CPU_ACCESS_WRITE; Flag <<= 1)
    {
        if (CpuAccessFlags & Flag)
        {
            if (Str.length())
                Str += '|';
            Str += GetSingleCPUAccessFlagString(Flag);
            CpuAccessFlags &= ~Flag;
        }
    }
    VERIFY(CpuAccessFlags == 0, "Unknown CPU access flags left");
    return Str;
}